

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

FT_Int32 TT_MulFix14_long_long(FT_Int32 a,FT_Int b)

{
  longlong tmp;
  longlong ret;
  FT_Int b_local;
  FT_Int32 a_local;
  
  return (FT_Int32)(((long)a * (long)b >> 0x3f) + 0x2000 + (long)a * (long)b >> 0xe);
}

Assistant:

static __attribute__(( noinline ))
         __attribute__(( pure )) FT_Int32
  TT_MulFix14_long_long( FT_Int32  a,
                         FT_Int    b )
  {

    long long  ret = (long long)a * b;

    /* The following line assumes that right shifting of signed values */
    /* will actually preserve the sign bit.  The exact behaviour is    */
    /* undefined, but this is true on x86 and x86_64.                  */
    long long  tmp = ret >> 63;


    ret += 0x2000 + tmp;

    return (FT_Int32)( ret >> 14 );
  }